

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# eval.cpp
# Opt level: O3

ExecutionResult * __thiscall
SchemeSpecialForm::execute
          (ExecutionResult *__return_storage_ptr__,SchemeSpecialForm *this,
          list<std::shared_ptr<ASTNode>,_std::allocator<std::shared_ptr<ASTNode>_>_> *l,
          Context *context)

{
  undefined8 uVar1;
  _Any_data _Stack_48;
  code *local_38;
  code *local_30;
  
  std::__cxx11::list<std::shared_ptr<ASTNode>,_std::allocator<std::shared_ptr<ASTNode>_>_>::_M_erase
            (l,(l->
               super__List_base<std::shared_ptr<ASTNode>,_std::allocator<std::shared_ptr<ASTNode>_>_>
               )._M_impl._M_node.super__List_node_base._M_next);
  Registry<std::function<ExecutionResult_(const_std::__cxx11::list<std::shared_ptr<ASTNode>,_std::allocator<std::shared_ptr<ASTNode>_>_>_&,_const_Context_&)>_>
  ::get((function<ExecutionResult_(const_std::__cxx11::list<std::shared_ptr<ASTNode>,_std::allocator<std::shared_ptr<ASTNode>_>_>_&,_const_Context_&)>
         *)&_Stack_48,&this->name);
  if (local_38 != (code *)0x0) {
    (*local_30)(__return_storage_ptr__,&_Stack_48,l,context);
    if (local_38 != (code *)0x0) {
      (*local_38)(&_Stack_48,&_Stack_48,__destroy_functor);
    }
    return __return_storage_ptr__;
  }
  uVar1 = std::__throw_bad_function_call();
  __clang_call_terminate(uVar1);
}

Assistant:

ExecutionResult SchemeSpecialForm::execute(std::list<std::shared_ptr<ASTNode>> l, const Context &context)
{
    l.pop_front();
    return SpecialFormRegistry::get(name)(l, context);
}